

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lucky.c
# Opt level: O1

int minimalSwap(word *pInOut,word *pMinimal,word *PDuplicat,int nVars,char *pCanonPerm,
               char *tempArray,uint *p_uCanonPhase)

{
  ushort *puVar1;
  long lVar2;
  long lVar3;
  int iVar4;
  uint uVar5;
  ulong uVar6;
  ulong uVar7;
  size_t __n;
  size_t __n_00;
  uint local_5c;
  
  iVar4 = Kit_TruthWordNum_64bit(nVars);
  __n = (size_t)nVars;
  local_5c = *p_uCanonPhase;
  __n_00 = (size_t)(iVar4 << 3);
  memcpy(pMinimal,pInOut,__n_00);
  memcpy(PDuplicat,pInOut,__n_00);
  memcpy(tempArray,pCanonPerm,__n);
  Kit_TruthSwapAdjacentVars_64bit(pInOut,nVars,0);
  *(ushort *)pCanonPerm = *(short *)pCanonPerm << 8 | *(ushort *)pCanonPerm >> 8;
  uVar5 = *p_uCanonPhase;
  if (((uVar5 >> 1 ^ uVar5) & 1) != 0) {
    *p_uCanonPhase = uVar5 ^ 3;
  }
  if (2 < nVars) {
    uVar6 = 1;
    do {
      uVar5 = Kit_TruthWordNum_64bit(nVars);
      uVar7 = (ulong)uVar5;
      do {
        if ((int)uVar7 < 1) goto LAB_00560bab;
        lVar2 = uVar7 - 1;
        lVar3 = uVar7 - 1;
        uVar7 = uVar7 - 1;
      } while (pMinimal[lVar3] == pInOut[lVar2]);
      if (pInOut[lVar2] < pMinimal[lVar3]) {
        memcpy(pMinimal,pInOut,__n_00);
        memcpy(tempArray,pCanonPerm,__n);
        local_5c = *p_uCanonPhase;
      }
      else {
LAB_00560bab:
        memcpy(pInOut,pMinimal,__n_00);
        memcpy(pCanonPerm,tempArray,__n);
        *p_uCanonPhase = local_5c;
      }
      Kit_TruthSwapAdjacentVars_64bit(pInOut,nVars,(int)uVar6);
      puVar1 = (ushort *)(pCanonPerm + uVar6);
      *puVar1 = *puVar1 << 8 | *puVar1 >> 8;
      uVar7 = uVar6 + 1;
      uVar5 = *p_uCanonPhase;
      if (((uVar5 >> ((byte)uVar7 & 0x1f) ^ uVar5 >> ((byte)uVar6 & 0x1f)) & 1) != 0) {
        *p_uCanonPhase = uVar5 ^ 3 << ((byte)uVar6 & 0x1f);
      }
      uVar6 = uVar7;
    } while (uVar7 != nVars - 1);
  }
  uVar5 = Kit_TruthWordNum_64bit(nVars);
  uVar6 = (ulong)uVar5;
  do {
    if ((int)uVar6 < 1) goto LAB_00560c73;
    lVar2 = uVar6 - 1;
    lVar3 = uVar6 - 1;
    uVar6 = uVar6 - 1;
  } while (pMinimal[lVar3] == pInOut[lVar2]);
  if (pMinimal[lVar3] <= pInOut[lVar2]) {
    memcpy(pInOut,pMinimal,__n_00);
    memcpy(pCanonPerm,tempArray,__n);
    *p_uCanonPhase = local_5c;
  }
LAB_00560c73:
  iVar4 = bcmp(pInOut,PDuplicat,__n_00);
  return (int)(iVar4 != 0);
}

Assistant:

int minimalSwap(word* pInOut, word* pMinimal, word* PDuplicat, int  nVars, char * pCanonPerm, char * tempArray, unsigned* p_uCanonPhase) 
{
    int i;  
    int blockSizeWord = Kit_TruthWordNum_64bit( nVars )*sizeof(word);
    int blockSizeChar = nVars *sizeof(char);
    unsigned TempuCanonPhase = *p_uCanonPhase;
    memcpy(pMinimal, pInOut, blockSizeWord);
    memcpy(PDuplicat, pInOut, blockSizeWord);
    memcpy(tempArray, pCanonPerm, blockSizeChar);  
    Kit_TruthSwapAdjacentVars_64bit( pInOut, nVars, 0 );
    swapInfoAdjacentVars(0, pCanonPerm, p_uCanonPhase);
    for(i=1;i<nVars-1;i++)
    {
        if( memCompare(pMinimal,pInOut,nVars) == 1)
        {
            memcpy(pMinimal, pInOut, blockSizeWord);
            memcpy(tempArray, pCanonPerm, blockSizeChar);
            TempuCanonPhase = *p_uCanonPhase;
            
        }
        else
        {
            memcpy(pInOut, pMinimal, blockSizeWord);
            memcpy(pCanonPerm, tempArray, blockSizeChar);
            *p_uCanonPhase = TempuCanonPhase;
        }
        Kit_TruthSwapAdjacentVars_64bit( pInOut, nVars, i );
        swapInfoAdjacentVars(i, pCanonPerm, p_uCanonPhase);
    }
    if( memCompare(pMinimal,pInOut,nVars) == -1)
    {
        memcpy(pInOut, pMinimal, blockSizeWord);
        memcpy(pCanonPerm, tempArray, blockSizeChar);
        *p_uCanonPhase = TempuCanonPhase;
    }
    if(memcmp(pInOut,PDuplicat,blockSizeWord) == 0)
        return 0;
    else
        return 1;
}